

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_inherit_coarsen_tmpl<double>
               (Mesh *old_mesh,Mesh *new_mesh,Adj *keys2doms,Int prod_dim,LOs *prods2new_ents,
               LOs *same_ents2old_ents,LOs *same_ents2new_ents,TagBase *tagbase)

{
  Int width;
  string *psVar1;
  Tag<double> *this;
  Read<double> local_110;
  Read<int> local_100;
  Read<int> local_f0;
  Read<int> local_e0;
  Read<double> local_d0;
  Read<int> local_c0;
  Write<signed_char> local_b0;
  undefined1 local_a0 [8];
  Read<double> prod_data;
  LOs key_doms2doms;
  Read<double> dom_data;
  Int ncomps;
  Tag<double> *old_tag;
  string name;
  LOs *same_ents2old_ents_local;
  LOs *prods2new_ents_local;
  Int prod_dim_local;
  Adj *keys2doms_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  psVar1 = TagBase::name_abi_cxx11_(tagbase);
  std::__cxx11::string::string((string *)&old_tag,(string *)psVar1);
  this = as<double>(tagbase);
  width = TagBase::ncomps(&this->super_TagBase);
  Tag<double>::array((Tag<double> *)&key_doms2doms.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&prod_data.write_.shared_alloc_.direct_ptr,
                  &(keys2doms->super_Graph).ab2b);
  Read<int>::Read(&local_c0,(Read<int> *)&prod_data.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_d0,(Read<double> *)&key_doms2doms.write_.shared_alloc_.direct_ptr);
  unmap<double>((Omega_h *)&local_b0,&local_c0,(Read<signed_char> *)&local_d0,width);
  read<double>((Omega_h *)local_a0,&local_b0);
  Write<double>::~Write((Write<double> *)&local_b0);
  Read<double>::~Read(&local_d0);
  Read<int>::~Read(&local_c0);
  Read<int>::Read(&local_e0,same_ents2old_ents);
  Read<int>::Read(&local_f0,same_ents2new_ents);
  Read<int>::Read(&local_100,prods2new_ents);
  Read<double>::Read(&local_110,(Read<double> *)local_a0);
  transfer_common<double>
            (old_mesh,new_mesh,prod_dim,&local_e0,&local_f0,&local_100,&this->super_TagBase,
             &local_110);
  Read<double>::~Read(&local_110);
  Read<int>::~Read(&local_100);
  Read<int>::~Read(&local_f0);
  Read<int>::~Read(&local_e0);
  Read<double>::~Read((Read<double> *)local_a0);
  Read<int>::~Read((Read<int> *)&prod_data.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&key_doms2doms.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)&old_tag);
  return;
}

Assistant:

static void transfer_inherit_coarsen_tmpl(Mesh* old_mesh, Mesh* new_mesh,
    Adj keys2doms, Int prod_dim, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, TagBase const* tagbase) {
  auto name = tagbase->name();
  auto old_tag = as<T>(tagbase);
  auto ncomps = old_tag->ncomps();
  auto dom_data = old_tag->array();
  auto key_doms2doms = keys2doms.ab2b;
  auto prod_data = read(unmap(key_doms2doms, dom_data, ncomps));
  transfer_common(old_mesh, new_mesh, prod_dim, same_ents2old_ents,
      same_ents2new_ents, prods2new_ents, old_tag, prod_data);
}